

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O2

uint8_t __thiscall
ans_byte_decode::decode_sym(ans_byte_decode *this,uint64_t *state,uint8_t **in_u8)

{
  pointer pdVar1;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  pdVar1 = (this->table).super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = this->frame_mask & *state;
  uVar4 = (ulong)pdVar1[uVar3].offset +
          (*state >> ((ulong)(byte)this->frame_log2 & 0x3f)) * (ulong)pdVar1[uVar3].freq;
  *state = uVar4;
  if (uVar4 < this->lower_bound) {
    puVar2 = *in_u8;
    *in_u8 = puVar2 + -4;
    *state = (ulong)*(uint *)(puVar2 + -4) | uVar4 << 0x20;
  }
  return pdVar1[uVar3].sym;
}

Assistant:

uint8_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        const auto& entry = table[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        return entry.sym;
    }